

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwio.c
# Opt level: O3

void png_write_data(png_structrp png_ptr,png_const_bytep data,size_t length)

{
  if (png_ptr->write_data_fn != (png_rw_ptr)0x0) {
    (*png_ptr->write_data_fn)(png_ptr,data,length);
    return;
  }
  png_error(png_ptr,"Call to NULL write function");
}

Assistant:

void /* PRIVATE */
png_write_data(png_structrp png_ptr, png_const_bytep data, size_t length)
{
   /* NOTE: write_data_fn must not change the buffer! */
   if (png_ptr->write_data_fn != NULL )
      (*(png_ptr->write_data_fn))(png_ptr, png_constcast(png_bytep,data),
          length);

   else
      png_error(png_ptr, "Call to NULL write function");
}